

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_positions.hpp
# Opt level: O0

void __thiscall
text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::cluster1
          (text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> *this,
          uint i,uint j)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  reference rVar7;
  uint temp_1;
  uint ab_end;
  uint ab_start;
  cpair ab_2;
  uint k;
  uint null_start;
  uint k_3;
  uint temp;
  cpair ab_1;
  uint k_2;
  uint t;
  cpair ab;
  uint k_1;
  vector<bool,_std::allocator<bool>_> distinct_pair_positions;
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  H1;
  mapped_type *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  value_type in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  value_type vVar8;
  undefined4 in_stack_fffffffffffffdcc;
  mapped_type *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  byte in_stack_fffffffffffffddf;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffde0;
  bool local_209;
  reference local_110;
  uint local_100;
  uint local_fc;
  cpair local_f8;
  uint local_f0;
  uint local_ec;
  reference local_e8;
  uint local_d8;
  uint local_d4;
  cpair local_d0;
  reference local_c8;
  uint local_b8;
  uint local_b4;
  int local_b0 [2];
  pair<unsigned_int,_unsigned_int> local_a8;
  reference local_a0;
  cpair local_90;
  uint local_88;
  undefined1 local_71;
  uint local_10;
  uint local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::unordered_map((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   *)0x1304fa);
  local_71 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x13052f);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffde0,CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8)
             ,(bool *)in_stack_fffffffffffffdd0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  std::allocator<bool>::~allocator((allocator<bool> *)0x130563);
  local_209 = (bool)in_stack_fffffffffffffddf;
  for (local_88 = local_c; local_88 < local_10; local_88 = local_88 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20),
               (ulong)local_88);
    bVar2 = skippable_text<unsigned_int,_unsigned_int>::is_blank
                      ((skippable_text<unsigned_int,_unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                       (uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    if (!bVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20),
                 (ulong)local_88);
      local_90 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                           ((skippable_text<unsigned_int,_unsigned_int> *)
                            CONCAT17(local_209,in_stack_fffffffffffffdd8),
                            (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
      bVar2 = std::operator!=((pair<unsigned_int,_unsigned_int> *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              in_stack_fffffffffffffdb8);
      if (bVar2) {
        sVar4 = std::
                unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                ::count((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        in_stack_fffffffffffffdb8);
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffde0,CONCAT17(local_209,in_stack_fffffffffffffdd8));
        local_a0 = rVar7;
        std::_Bit_reference::operator=(&local_a0,sVar4 == 0);
        sVar4 = std::
                unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                ::count((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        in_stack_fffffffffffffdb8);
        if (sVar4 == 0) {
          local_b0[1] = 0;
          local_b0[0] = 0;
          std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
                    (&local_a8,local_b0 + 1,local_b0);
          pmVar5 = std::
                   unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                   ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                in_stack_fffffffffffffdb8);
          std::pair<unsigned_int,_unsigned_int>::operator=(pmVar5,&local_a8);
        }
        pmVar5 = std::
                 unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                 ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              in_stack_fffffffffffffdb8);
        pmVar5->first = pmVar5->first + 1;
      }
    }
  }
  local_b4 = local_c;
  for (local_b8 = local_c; local_b8 < local_10; local_b8 = local_b8 + 1) {
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_fffffffffffffde0,CONCAT17(local_209,in_stack_fffffffffffffdd8));
    local_c8 = rVar7;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
    if (bVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20),
                 (ulong)local_b8);
      local_d0 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                           ((skippable_text<unsigned_int,_unsigned_int> *)
                            CONCAT17(local_209,in_stack_fffffffffffffdd8),
                            (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
      pmVar5 = std::
               unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      uVar3 = local_b4;
      local_d4 = pmVar5->first;
      pmVar5 = std::
               unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      uVar1 = local_b4;
      pmVar5->first = uVar3;
      pmVar5 = std::
               unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      pmVar5->second = uVar1;
      local_b4 = local_d4 + local_b4;
    }
  }
  for (local_d8 = local_c; local_d8 < local_10; local_d8 = local_d8 + 1) {
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_fffffffffffffde0,CONCAT17(local_209,in_stack_fffffffffffffdd8));
    local_e8 = rVar7;
    std::_Bit_reference::operator=(&local_e8,false);
  }
  local_ec = local_b4;
  local_f0 = local_c;
  while (local_f0 < local_10) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20),
               (ulong)local_f0);
    local_f8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                         ((skippable_text<unsigned_int,_unsigned_int> *)
                          CONCAT17(local_209,in_stack_fffffffffffffdd8),
                          (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    bVar2 = std::operator==(&local_f8,(pair<unsigned_int,_unsigned_int> *)(in_RDI + 0x3c));
    if (bVar2) {
      local_fc = local_ec;
      local_100 = local_b4;
    }
    else {
      pmVar5 = std::
               unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      local_fc = pmVar5->first;
      pmVar5 = std::
               unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
               ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdb8);
      local_100 = pmVar5->second;
    }
    if ((local_f0 < local_fc) || (local_100 < local_f0)) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20),
                          (ulong)local_f0);
      vVar8 = *pvVar6;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20),
                          (ulong)local_100);
      in_stack_fffffffffffffdc4 = *pvVar6;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20),
                          (ulong)local_f0);
      *pvVar6 = in_stack_fffffffffffffdc4;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x20),
                          (ulong)local_100);
      *pvVar6 = vVar8;
      bVar2 = std::operator==(&local_f8,(pair<unsigned_int,_unsigned_int> *)(in_RDI + 0x3c));
      if (bVar2) {
        local_b4 = local_b4 + 1;
      }
      else {
        in_stack_fffffffffffffdb8 =
             std::
             unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                          in_stack_fffffffffffffdb8);
        in_stack_fffffffffffffdb8->second = in_stack_fffffffffffffdb8->second + 1;
      }
    }
    else {
      local_209 = false;
      if (local_f0 == local_fc) {
        local_209 = std::operator!=((pair<unsigned_int,_unsigned_int> *)
                                    CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                    in_stack_fffffffffffffdb8);
      }
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffde0,CONCAT17(local_209,in_stack_fffffffffffffdd8));
      in_stack_fffffffffffffde0 = (vector<bool,_std::allocator<bool>_> *)rVar7._M_mask;
      local_110 = rVar7;
      std::_Bit_reference::operator=(&local_110,(bool)(local_209 & 1));
      local_f0 = local_f0 + 1;
      bVar2 = std::operator==(&local_f8,(pair<unsigned_int,_unsigned_int> *)(in_RDI + 0x3c));
      if (bVar2) {
        local_b4 = (local_100 == local_f0) + local_b4;
      }
      else {
        uVar3 = (uint)(local_100 == local_f0);
        in_stack_fffffffffffffdd0 =
             std::
             unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
             ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                          in_stack_fffffffffffffdb8);
        in_stack_fffffffffffffdd0->second = uVar3 + in_stack_fffffffffffffdd0->second;
      }
    }
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x130dc5)
  ;
  std::
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  ::~unordered_map((unordered_map<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                    *)0x130dd2);
  return;
}

Assistant:

void cluster1(itype i, itype j){

		unordered_map<cpair,ipair> H1;

		assert(i<size());
		assert(j<=size());
		assert(i<j);

		//mark in a bitvector only one position per distinct pair
		auto distinct_pair_positions = vector<bool>(j-i,false);

		//first step: count frequencies
		for(itype k = i; k<j; ++k){

			if(not T->is_blank(TP[k])){

				cpair ab = T->pair_starting_at(TP[k]);

				if(ab != nullpair ){

					//write a '1' iff this is the first time we see this pair
					distinct_pair_positions[k-i] = (H1.count(ab)==0);

					if(H1.count(ab)==0) H1[ab] = {0,0};

					H1[ab].first++;

				}

			}

		}

		itype t = i;//cumulated freq

		//second step: cumulate frequencies
		for(itype k = i; k<j; ++k){

			if(distinct_pair_positions[k-i]){

				cpair ab = T->pair_starting_at(TP[k]);

				assert(ab != nullpair);

				itype temp = H1[ab].first;

				H1[ab].first = t;
				H1[ab].second = t;

				t += temp;

			}

		}

		//clear bitvector content
		for(itype k = i; k<j;++k) distinct_pair_positions[k-i] = false;

		//t is the starting position of null pairs

		itype null_start = t;

		//third step: cluster
		itype k = i; //current position in TP

		//invariant: TP[i,...,k] is clustered
		while(k<j){

			cpair ab = T->pair_starting_at(TP[k]);

			itype ab_start;
			itype ab_end;

			if(ab==nullpair){

				ab_start = null_start;
				ab_end = t;

			}else{

				ab_start = H1[ab].first;
				ab_end = H1[ab].second;

			}

			if(k >= ab_start and k <= ab_end){

				//if k is the first position where a distinct pair (other than nullpair)
				//is seen in the sorted vector, mark it on distinct_pair_positions
				distinct_pair_positions[k-i] = (k==ab_start and ab!=nullpair);

				//dist_pairs += distinct_pair_positions[k-i];

				//case 1: ab is the right place: increment k
				k++;

				if(ab==nullpair){

					t += (ab_end == k);

				}else{

					//if k is exactly next ab position, increment next ab position
					H1[ab].second += (ab_end == k);

				}

			}else{

				//ab has to go to ab_end. swap TP[k] and TP[ab_end]
				itype temp = TP[k];
				TP[k] = TP[ab_end];
				TP[ab_end] = temp;

				if(ab==nullpair){

					t++;

				}else{

					//move forward ab_end since we inserted an ab on top of the list of ab's
					H1[ab].second++;

				}

			}

		}

		assert(is_clustered(i,j));

	}